

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O0

void raviX_print_ast_node(TextBuffer *buf,AstNode *node,int level)

{
  ravitype_t rVar1;
  char *pcVar2;
  undefined1 local_48 [8];
  PtrListIterator test_then_blockiter__;
  void *pvStack_28;
  _Bool is_first;
  AstNode *test_then_block;
  int level_local;
  AstNode *node_local;
  TextBuffer *buf_local;
  
  switch(node->type) {
  case AST_NONE:
    break;
  case STMT_RETURN:
    printf_buf(buf,"%preturn\n",(ulong)(uint)level);
    print_ast_node_list(buf,(node->field_2).expression_stmt.var_expr_list,level + 1,",");
    break;
  case STMT_GOTO:
    printf_buf(buf,"%pgoto %t\n",(ulong)(uint)level,(node->field_2).goto_stmt.name);
    break;
  case STMT_LABEL:
    printf_buf(buf,"%p::%t::\n",(ulong)(uint)level,((node->field_2).local_stmt.var_list)->prev_);
    break;
  case STMT_DO:
    printf_buf(buf,"%pdo\n",(ulong)(uint)level);
    print_locals_in_scope(buf,(node->field_2).do_stmt.scope,level);
    print_ast_node_list(buf,(node->field_2).local_stmt.expr_list,level + 1,(char *)0x0);
    printf_buf(buf,"%pend\n",(ulong)(uint)level);
    break;
  case STMT_LOCAL:
    printf_buf(buf,"%plocal\n",(ulong)(uint)level);
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[symbols]");
    print_symbol_list(buf,(node->field_2).local_stmt.var_list,level + 1,",");
    if ((node->field_2).goto_stmt.name != (StringObject *)0x0) {
      printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[expressions]");
      print_ast_node_list(buf,(node->field_2).local_stmt.expr_list,level + 1,",");
    }
    break;
  case STMT_FUNCTION:
    raviX_print_ast_node(buf,(node->field_2).function_stmt.name,level);
    if ((node->field_2).goto_stmt.name != (StringObject *)0x0) {
      printf_buf(buf,"%p%c\n",(ulong)(level + 1),"[selectors]");
      print_ast_node_list(buf,(node->field_2).local_stmt.expr_list,level + 2,(char *)0x0);
    }
    if ((node->field_2).goto_stmt.goto_scope != (Scope *)0x0) {
      printf_buf(buf,"%p%c\n",(ulong)(level + 1),"[method name]");
      raviX_print_ast_node(buf,(node->field_2).function_stmt.method_name,level + 2);
    }
    printf_buf(buf,"%p=\n",(ulong)(level + 1));
    raviX_print_ast_node(buf,(node->field_2).function_stmt.function_expr,level + 2);
    break;
  case STMT_IF:
    test_then_blockiter__._23_1_ = 1;
    raviX_ptrlist_forward_iterator
              ((PtrListIterator *)local_48,(PtrList *)(node->field_2).local_stmt.var_list);
    pvStack_28 = raviX_ptrlist_iter_next((PtrListIterator *)local_48);
    while (pvStack_28 != (void *)0x0) {
      if ((test_then_blockiter__._23_1_ & 1) == 0) {
        printf_buf(buf,"%pelseif\n",(ulong)(uint)level);
      }
      else {
        test_then_blockiter__._23_1_ = 0;
        printf_buf(buf,"%pif\n",(ulong)(uint)level);
      }
      print_locals_in_scope(buf,*(Scope **)((long)pvStack_28 + 0x10),level);
      raviX_print_ast_node(buf,*(AstNode **)((long)pvStack_28 + 8),level + 1);
      printf_buf(buf,"%pthen\n",(ulong)(uint)level);
      print_ast_node_list(buf,*(AstNodeList **)((long)pvStack_28 + 0x18),level + 1,(char *)0x0);
      pvStack_28 = raviX_ptrlist_iter_next((PtrListIterator *)local_48);
    }
    if ((node->field_2).goto_stmt.name != (StringObject *)0x0) {
      printf_buf(buf,"%pelse\n",(ulong)(uint)level);
      print_locals_in_scope(buf,(node->field_2).test_then_block.test_then_scope,level);
      print_ast_node_list(buf,(node->field_2).test_then_block.test_then_statement_list,level + 1,
                          (char *)0x0);
    }
    printf_buf(buf,"%pend\n",(ulong)(uint)level);
    break;
  default:
    printf_buf(buf,"%pUnsupported node type %d\n",(ulong)(uint)level,(ulong)node->type);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_printer.c"
                  ,0x259,"void raviX_print_ast_node(TextBuffer *, AstNode *, int)");
  case STMT_WHILE:
    printf_buf(buf,"%pwhile\n",(ulong)(uint)level);
    print_locals_in_scope(buf,(node->field_2).test_then_block.test_then_scope,level);
    raviX_print_ast_node(buf,(node->field_2).function_stmt.name,level + 1);
    printf_buf(buf,"%pdo\n",(ulong)(uint)level);
    print_ast_node_list(buf,(node->field_2).test_then_block.test_then_statement_list,level + 1,
                        (char *)0x0);
    printf_buf(buf,"%pend\n",(ulong)(uint)level);
    break;
  case STMT_FOR_IN:
    printf_buf(buf,"%pfor\n",(ulong)(uint)level);
    print_locals_in_scope(buf,(node->field_2).do_stmt.scope,level);
    print_symbol_list(buf,(node->field_2).for_stmt.symbols,level + 1,",");
    printf_buf(buf,"%pin\n",(ulong)(uint)level);
    print_ast_node_list(buf,(node->field_2).test_then_block.test_then_statement_list,level + 1,",");
    printf_buf(buf,"%pdo\n",(ulong)(uint)level);
    print_locals_in_scope(buf,(node->field_2).for_stmt.for_body,level);
    print_statement_list(buf,(node->field_2).for_stmt.for_statement_list,level + 1);
    printf_buf(buf,"%pend\n",(ulong)(uint)level);
    break;
  case STMT_FOR_NUM:
    printf_buf(buf,"%pfor\n",(ulong)(uint)level);
    print_locals_in_scope(buf,(node->field_2).do_stmt.scope,level);
    print_symbol_list(buf,(node->field_2).for_stmt.symbols,level + 1,(char *)0x0);
    printf_buf(buf,"%p=\n",(ulong)(uint)level);
    print_ast_node_list(buf,(node->field_2).test_then_block.test_then_statement_list,level + 1,",");
    printf_buf(buf,"%pdo\n",(ulong)(uint)level);
    print_locals_in_scope(buf,(node->field_2).for_stmt.for_body,level);
    print_statement_list(buf,(node->field_2).for_stmt.for_statement_list,level + 1);
    printf_buf(buf,"%pend\n",(ulong)(uint)level);
    break;
  case STMT_REPEAT:
    printf_buf(buf,"%prepeat\n",(ulong)(uint)level);
    print_locals_in_scope(buf,(node->field_2).test_then_block.test_then_scope,level);
    print_ast_node_list(buf,(node->field_2).test_then_block.test_then_statement_list,level + 1,
                        (char *)0x0);
    printf_buf(buf,"%puntil\n",(ulong)(uint)level);
    raviX_print_ast_node(buf,(node->field_2).function_stmt.name,level + 1);
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[repeat end]");
    break;
  case STMT_EXPR:
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[expression statement start]");
    if ((node->field_2).local_stmt.var_list != (LuaSymbolList *)0x0) {
      printf_buf(buf,"%p%c\n",(ulong)(level + 1),"[var list start]");
      print_ast_node_list(buf,(node->field_2).expression_stmt.var_expr_list,level + 2,",");
      printf_buf(buf,"%p= %c\n",(ulong)(level + 1),"[var list end]");
    }
    printf_buf(buf,"%p%c\n",(ulong)(level + 1),"[expression list start]");
    print_ast_node_list(buf,(node->field_2).local_stmt.expr_list,level + 2,",");
    printf_buf(buf,"%p%c\n",(ulong)(level + 1),"[expression list end]");
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[expression statement end]");
    break;
  case STMT_EMBEDDED_C:
    printf_buf(buf,"%pC (\n",(ulong)(uint)level);
    print_symbol_list(buf,(node->field_2).local_stmt.var_list,level + 1,",");
    printf_buf(buf,"%p  ) \'%t\'\n",(ulong)(uint)level,(node->field_2).goto_stmt.name);
    break;
  case EXPR_LITERAL:
    printf_buf(buf,"%p",(ulong)(uint)level);
    rVar1 = (node->field_2).common_expr.type.type_code;
    if (rVar1 == RAVI_TNIL) {
      printf_buf(buf,"nil");
    }
    else if (rVar1 == RAVI_TBOOLEAN) {
      printf_buf(buf,"%b",(node->field_2).function_stmt.function_expr);
    }
    else if (rVar1 == RAVI_TNUMINT) {
      printf_buf(buf,"%i",(node->field_2).function_stmt.function_expr);
    }
    else if (rVar1 == RAVI_TNUMFLT) {
      printf_buf(buf,"%f",(node->field_2).function_stmt.function_expr);
    }
    else if (rVar1 == RAVI_TSTRING) {
      printf_buf(buf,"\'%t\'",(node->field_2).function_stmt.function_expr);
    }
    else {
      if (rVar1 != RAVI_TVARARGS) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_printer.c"
                      ,0x224,"void raviX_print_ast_node(TextBuffer *, AstNode *, int)");
      }
      printf_buf(buf,"...");
    }
    printf_buf(buf,"\n");
    break;
  case EXPR_SYMBOL:
    print_symbol(buf,(node->field_2).symbol_expr.var,level + 1);
    break;
  case EXPR_Y_INDEX:
    printf_buf(buf,"%p%c %T\n",(ulong)(uint)level,"[Y index start]",&node->field_2);
    printf_buf(buf,"%p[\n",(ulong)(level + 1));
    raviX_print_ast_node(buf,(node->field_2).function_stmt.function_expr,level + 2);
    printf_buf(buf,"%p]\n",(ulong)(level + 1));
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[Y index end]");
    break;
  case EXPR_FIELD_SELECTOR:
    printf_buf(buf,"%p%c %T\n",(ulong)(uint)level,"[field selector start]",&node->field_2);
    printf_buf(buf,"%p.\n",(ulong)(level + 1));
    raviX_print_ast_node(buf,(node->field_2).function_stmt.function_expr,level + 2);
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[field selector end]");
    break;
  case EXPR_TABLE_ELEMENT_ASSIGN:
    printf_buf(buf,"%p%c %T\n",(ulong)(uint)level,"[indexed assign start]",&node->field_2);
    if ((node->field_2).function_stmt.function_expr != (AstNode *)0x0) {
      printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[index start]");
      raviX_print_ast_node(buf,(node->field_2).function_stmt.function_expr,level + 1);
      printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[index end]");
    }
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[value start]");
    raviX_print_ast_node(buf,(node->field_2).binary_expr.expr_right,level + 1);
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[value end]");
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[indexed assign end]");
    break;
  case EXPR_SUFFIXED:
    printf_buf(buf,"%p%c %T\n",(ulong)(uint)level,"[suffixed expr start]",&node->field_2);
    printf_buf(buf,"%p%c %T\n",(ulong)(level + 1),"[primary start]",
               &((node->field_2).function_stmt.function_expr)->field_2);
    raviX_print_ast_node(buf,(node->field_2).function_stmt.function_expr,level + 2);
    printf_buf(buf,"%p%c\n",(ulong)(level + 1),"[primary end]");
    if ((node->field_2).for_stmt.for_statement_list != (AstNodeList *)0x0) {
      printf_buf(buf,"%p%c\n",(ulong)(level + 1),"[suffix list start]");
      print_ast_node_list(buf,(node->field_2).for_stmt.for_statement_list,level + 2,(char *)0x0);
      printf_buf(buf,"%p%c\n",(ulong)(level + 1),"[suffix list end]");
    }
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[suffixed expr end]");
    break;
  case EXPR_UNARY:
    printf_buf(buf,"%p%c %T\n",(ulong)(uint)level,"[unary expr start]",&node->field_2);
    pcVar2 = raviX_get_unary_opr_str((node->field_2).unary_expr.unary_op);
    printf_buf(buf,"%p%s\n",(ulong)(uint)level,pcVar2);
    raviX_print_ast_node(buf,(node->field_2).function_stmt.function_expr,level + 1);
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[unary expr end]");
    break;
  case EXPR_BINARY:
    printf_buf(buf,"%p%c %T\n",(ulong)(uint)level,"[binary expr start]",&node->field_2);
    raviX_print_ast_node(buf,(node->field_2).function_stmt.function_expr,level + 1);
    pcVar2 = raviX_get_binary_opr_str((node->field_2).binary_expr.binary_op);
    printf_buf(buf,"%p%s\n",(ulong)(uint)level,pcVar2);
    raviX_print_ast_node(buf,(node->field_2).binary_expr.expr_right,level + 1);
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[binary expr end]");
    break;
  case EXPR_FUNCTION:
    if ((node->field_2).function_expr.args == (LuaSymbolList *)0x0) {
      printf_buf(buf,"%pfunction()\n",(ulong)(uint)level);
    }
    else {
      printf_buf(buf,"%pfunction(\n",(ulong)(uint)level);
      print_symbol_list(buf,(node->field_2).function_expr.args,level + 1,",");
      printf_buf(buf,"%p)\n",(ulong)(uint)level);
    }
    if ((node->field_2).function_expr.upvalues != (LuaSymbolList *)0x0) {
      printf_buf(buf,"%p%c ",(ulong)(uint)level,"upvalues ");
      print_symbol_names(buf,(node->field_2).function_expr.upvalues);
      printf_buf(buf,"\n");
    }
    print_locals_in_scope(buf,(node->field_2).function_expr.main_block,level);
    print_statement_list(buf,(node->field_2).function_expr.function_statement_list,level);
    printf_buf(buf,"%pend\n",(ulong)(uint)level);
    break;
  case EXPR_TABLE_LITERAL:
    printf_buf(buf,"%p{ %c %T\n",(ulong)(uint)level,"[table constructor start]",&node->field_2);
    print_ast_node_list(buf,(node->field_2).table_expr.expr_list,level + 1,",");
    printf_buf(buf,"%p} %c\n",(ulong)(uint)level,"[table constructor end]");
    break;
  case EXPR_FUNCTION_CALL:
    printf_buf(buf,"%p%c %T\n",(ulong)(uint)level,"[function call start]",&node->field_2);
    if ((node->field_2).function_stmt.function_expr == (AstNode *)0x0) {
      printf_buf(buf,"%p(\n",(ulong)(level + 1));
    }
    else {
      printf_buf(buf,"%p: %t (\n",(ulong)(level + 1),(node->field_2).function_stmt.function_expr);
    }
    print_ast_node_list(buf,(node->field_2).for_stmt.for_statement_list,level + 2,",");
    printf_buf(buf,"%p)\n",(ulong)(level + 1));
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[function call end]");
    break;
  case EXPR_CONCAT:
    printf_buf(buf,"%p%c %T\n",(ulong)(uint)level,"[concat start]",&node->field_2);
    print_ast_node_list(buf,(node->field_2).table_expr.expr_list,level + 1,",");
    printf_buf(buf,"%p%c\n",(ulong)(uint)level,"[concat end]");
    break;
  case EXPR_BUILTIN:
    printf_buf(buf,"%p%s %c%T\n",(ulong)(uint)level,"C__new(","",&node->field_2);
    printf_buf(buf,"%p)\n",(ulong)(uint)level);
  }
  return;
}

Assistant:

void raviX_print_ast_node(TextBuffer *buf, AstNode *node, int level)
{
	switch (node->type) {
	case EXPR_FUNCTION: {
		if (node->function_expr.args) {
			printf_buf(buf, "%pfunction(\n", level);
			print_symbol_list(buf, node->function_expr.args, level + 1, ",");
			printf_buf(buf, "%p)\n", level);
		} else {
			printf_buf(buf, "%pfunction()\n", level);
		}
//		if (node->function_expr.locals) {
//			printf_buf(buf, "%p%c ", level, "locals ");
//			print_symbol_names(buf, node->function_expr.locals);
//			printf_buf(buf, "\n");
//		}
		if (node->function_expr.upvalues) {
			printf_buf(buf, "%p%c ", level, "upvalues ");
			print_symbol_names(buf, node->function_expr.upvalues);
			printf_buf(buf, "\n");
		}
		print_locals_in_scope(buf, node->function_expr.main_block, level);
		print_statement_list(buf, node->function_expr.function_statement_list, level);
		printf_buf(buf, "%pend\n", level);
		break;
	}
	case AST_NONE:
		break;
	case STMT_RETURN: {
		printf_buf(buf, "%preturn\n", level);
		print_ast_node_list(buf, node->return_stmt.expr_list, level + 1, ",");
		break;
	}
	case STMT_LOCAL: {
		printf_buf(buf, "%plocal\n", level);
		printf_buf(buf, "%p%c\n", level, "[symbols]");
		print_symbol_list(buf, node->local_stmt.var_list, level + 1, ",");
		if (node->local_stmt.expr_list) {
			printf_buf(buf, "%p%c\n", level, "[expressions]");
			print_ast_node_list(buf, node->local_stmt.expr_list, level + 1, ",");
		}
		break;
	}
	case STMT_FUNCTION: {
		raviX_print_ast_node(buf, node->function_stmt.name, level);
		if (node->function_stmt.selectors) {
			printf_buf(buf, "%p%c\n", level + 1, "[selectors]");
			print_ast_node_list(buf, node->function_stmt.selectors, level + 2, NULL);
		}
		if (node->function_stmt.method_name) {
			printf_buf(buf, "%p%c\n", level + 1, "[method name]");
			raviX_print_ast_node(buf, node->function_stmt.method_name, level + 2);
		}
		printf_buf(buf, "%p=\n", level + 1);
		raviX_print_ast_node(buf, node->function_stmt.function_expr, level + 2);
		break;
	}
	case STMT_LABEL: {
		printf_buf(buf, "%p::%t::\n", level, node->label_stmt.symbol->label.label_name);
		break;
	}
	case STMT_GOTO: {
		printf_buf(buf, "%pgoto %t\n", level, node->goto_stmt.name);
		break;
	}
	case STMT_DO: {
		printf_buf(buf, "%pdo\n", level);
		print_locals_in_scope(buf, node->do_stmt.scope, level);
		print_ast_node_list(buf, node->do_stmt.do_statement_list, level + 1, NULL);
		printf_buf(buf, "%pend\n", level);
		break;
	}
	case STMT_EXPR: {
		printf_buf(buf, "%p%c\n", level, "[expression statement start]");
		if (node->expression_stmt.var_expr_list) {
			printf_buf(buf, "%p%c\n", level + 1, "[var list start]");
			print_ast_node_list(buf, node->expression_stmt.var_expr_list, level + 2, ",");
			printf_buf(buf, "%p= %c\n", level + 1, "[var list end]");
		}
		printf_buf(buf, "%p%c\n", level + 1, "[expression list start]");
		print_ast_node_list(buf, node->expression_stmt.expr_list, level + 2, ",");
		printf_buf(buf, "%p%c\n", level + 1, "[expression list end]");
		printf_buf(buf, "%p%c\n", level, "[expression statement end]");
		break;
	}
	case STMT_IF: {
		AstNode *test_then_block;
		bool is_first = true;
		FOR_EACH_PTR(node->if_stmt.if_condition_list, AstNode, test_then_block)
		{
			if (is_first) {
				is_first = false;
				printf_buf(buf, "%pif\n", level);
			} else
				printf_buf(buf, "%pelseif\n", level);
			print_locals_in_scope(buf, test_then_block->test_then_block.test_then_scope, level);
			raviX_print_ast_node(buf, test_then_block->test_then_block.condition, level + 1);
			printf_buf(buf, "%pthen\n", level);
			print_ast_node_list(buf, test_then_block->test_then_block.test_then_statement_list, level + 1,
					    NULL);
		}
		END_FOR_EACH_PTR(node);
		if (node->if_stmt.else_block) {
			printf_buf(buf, "%pelse\n", level);
			print_locals_in_scope(buf, node->if_stmt.else_block, level);
			print_ast_node_list(buf, node->if_stmt.else_statement_list, level + 1, NULL);
		}
		printf_buf(buf, "%pend\n", level);
		break;
	}
	case STMT_WHILE: {
		printf_buf(buf, "%pwhile\n", level);
		print_locals_in_scope(buf, node->while_or_repeat_stmt.loop_scope, level);
		raviX_print_ast_node(buf, node->while_or_repeat_stmt.condition, level + 1);
		printf_buf(buf, "%pdo\n", level);
		print_ast_node_list(buf, node->while_or_repeat_stmt.loop_statement_list, level + 1, NULL);
		printf_buf(buf, "%pend\n", level);
		break;
	}
	case STMT_REPEAT: {
		printf_buf(buf, "%prepeat\n", level);
		print_locals_in_scope(buf, node->while_or_repeat_stmt.loop_scope, level);
		print_ast_node_list(buf, node->while_or_repeat_stmt.loop_statement_list, level + 1, NULL);
		printf_buf(buf, "%puntil\n", level);
		raviX_print_ast_node(buf, node->while_or_repeat_stmt.condition, level + 1);
		printf_buf(buf, "%p%c\n", level, "[repeat end]");
		break;
	}
	case STMT_FOR_IN: {
		printf_buf(buf, "%pfor\n", level);
		print_locals_in_scope(buf, node->for_stmt.for_scope, level);
		print_symbol_list(buf, node->for_stmt.symbols, level + 1, ",");
		printf_buf(buf, "%pin\n", level);
		print_ast_node_list(buf, node->for_stmt.expr_list, level + 1, ",");
		printf_buf(buf, "%pdo\n", level);
		print_locals_in_scope(buf, node->for_stmt.for_body, level);
		print_statement_list(buf, node->for_stmt.for_statement_list, level + 1);
		printf_buf(buf, "%pend\n", level);
		break;
	}
	case STMT_FOR_NUM: {
		printf_buf(buf, "%pfor\n", level);
		print_locals_in_scope(buf, node->for_stmt.for_scope, level);
		print_symbol_list(buf, node->for_stmt.symbols, level + 1, NULL);
		printf_buf(buf, "%p=\n", level);
		print_ast_node_list(buf, node->for_stmt.expr_list, level + 1, ",");
		printf_buf(buf, "%pdo\n", level);
		print_locals_in_scope(buf, node->for_stmt.for_body, level);
		print_statement_list(buf, node->for_stmt.for_statement_list, level + 1);
		printf_buf(buf, "%pend\n", level);
		break;
	}
	case STMT_EMBEDDED_C: {
		printf_buf(buf, "%pC (\n", level);
		print_symbol_list(buf, node->embedded_C_stmt.symbols, level + 1, ",");
		printf_buf(buf, "%p  ) '%t'\n", level, node->embedded_C_stmt.C_src_snippet);
		break;
	}
	case EXPR_SUFFIXED: {
		printf_buf(buf, "%p%c %T\n", level, "[suffixed expr start]", &node->suffixed_expr.type);
		printf_buf(buf, "%p%c %T\n", level + 1, "[primary start]",
			   &node->suffixed_expr.primary_expr->common_expr.type);
		raviX_print_ast_node(buf, node->suffixed_expr.primary_expr, level + 2);
		printf_buf(buf, "%p%c\n", level + 1, "[primary end]");
		if (node->suffixed_expr.suffix_list) {
			printf_buf(buf, "%p%c\n", level + 1, "[suffix list start]");
			print_ast_node_list(buf, node->suffixed_expr.suffix_list, level + 2, NULL);
			printf_buf(buf, "%p%c\n", level + 1, "[suffix list end]");
		}
		printf_buf(buf, "%p%c\n", level, "[suffixed expr end]");
		break;
	}
	case EXPR_FUNCTION_CALL: {
		printf_buf(buf, "%p%c %T\n", level, "[function call start]", &node->function_call_expr.type);
		if (node->function_call_expr.method_name) {
			printf_buf(buf, "%p: %t (\n", level + 1, node->function_call_expr.method_name);
		} else {
			printf_buf(buf, "%p(\n", level + 1);
		}
		print_ast_node_list(buf, node->function_call_expr.arg_list, level + 2, ",");
		printf_buf(buf, "%p)\n", level + 1);
		printf_buf(buf, "%p%c\n", level, "[function call end]");
		break;
	}
	case EXPR_SYMBOL: {
		print_symbol(buf, node->symbol_expr.var, level + 1);
		break;
	}
	case EXPR_BINARY: {
		printf_buf(buf, "%p%c %T\n", level, "[binary expr start]", &node->binary_expr.type);
		raviX_print_ast_node(buf, node->binary_expr.expr_left, level + 1);
		printf_buf(buf, "%p%s\n", level, raviX_get_binary_opr_str(node->binary_expr.binary_op));
		raviX_print_ast_node(buf, node->binary_expr.expr_right, level + 1);
		printf_buf(buf, "%p%c\n", level, "[binary expr end]");
		break;
	}
	case EXPR_UNARY: {
		printf_buf(buf, "%p%c %T\n", level, "[unary expr start]", &node->unary_expr.type);
		printf_buf(buf, "%p%s\n", level, raviX_get_unary_opr_str(node->unary_expr.unary_op));
		raviX_print_ast_node(buf, node->unary_expr.expr, level + 1);
		printf_buf(buf, "%p%c\n", level, "[unary expr end]");
		break;
	}
	case EXPR_LITERAL: {
		printf_buf(buf, "%p", level);
		switch (node->literal_expr.type.type_code) {
		case RAVI_TNIL:
			printf_buf(buf, "nil");
			break;
		case RAVI_TBOOLEAN:
			printf_buf(buf, "%b", node->literal_expr.u.i);
			break;
		case RAVI_TNUMINT:
			printf_buf(buf, "%i", node->literal_expr.u.i);
			break;
		case RAVI_TNUMFLT:
			printf_buf(buf, "%f", node->literal_expr.u.r);
			break;
		case RAVI_TSTRING:
			printf_buf(buf, "'%t'", node->literal_expr.u.ts);
			break;
		case RAVI_TVARARGS:
			printf_buf(buf, "...");
			break;
		default:
			assert(0);
		}
		printf_buf(buf, "\n");
		break;
	}
	case EXPR_FIELD_SELECTOR: {
		printf_buf(buf, "%p%c %T\n", level, "[field selector start]", &node->index_expr.type);
		printf_buf(buf, "%p.\n", level + 1);
		raviX_print_ast_node(buf, node->index_expr.expr, level + 2);
		printf_buf(buf, "%p%c\n", level, "[field selector end]");
		break;
	}
	case EXPR_Y_INDEX: {
		printf_buf(buf, "%p%c %T\n", level, "[Y index start]", &node->index_expr.type);
		printf_buf(buf, "%p[\n", level + 1);
		raviX_print_ast_node(buf, node->index_expr.expr, level + 2);
		printf_buf(buf, "%p]\n", level + 1);
		printf_buf(buf, "%p%c\n", level, "[Y index end]");
		break;
	}
	case EXPR_TABLE_ELEMENT_ASSIGN: {
		printf_buf(buf, "%p%c %T\n", level, "[indexed assign start]", &node->table_elem_assign_expr.type);
		if (node->table_elem_assign_expr.key_expr) {
			printf_buf(buf, "%p%c\n", level, "[index start]");
			raviX_print_ast_node(buf, node->table_elem_assign_expr.key_expr, level + 1);
			printf_buf(buf, "%p%c\n", level, "[index end]");
		}
		printf_buf(buf, "%p%c\n", level, "[value start]");
		raviX_print_ast_node(buf, node->table_elem_assign_expr.value_expr, level + 1);
		printf_buf(buf, "%p%c\n", level, "[value end]");
		printf_buf(buf, "%p%c\n", level, "[indexed assign end]");
		break;
	}
	case EXPR_TABLE_LITERAL: {
		printf_buf(buf, "%p{ %c %T\n", level, "[table constructor start]", &node->table_expr.type);
		print_ast_node_list(buf, node->table_expr.expr_list, level + 1, ",");
		printf_buf(buf, "%p} %c\n", level, "[table constructor end]");
		break;
	}
	case EXPR_CONCAT: {
		printf_buf(buf, "%p%c %T\n", level, "[concat start]", &node->string_concatenation_expr.type);
		print_ast_node_list(buf, node->string_concatenation_expr.expr_list, level + 1, ",");
		printf_buf(buf, "%p%c\n", level, "[concat end]");
		break;
	}
	case EXPR_BUILTIN: {
		printf_buf(buf, "%p%s %c%T\n", level, "C__new(", "", &node->builtin_expr.type);
		// TODO print contents
		printf_buf(buf, "%p)\n", level);
		break;
	}
	default:
		printf_buf(buf, "%pUnsupported node type %d\n", level, node->type);
		assert(0);
	}
}